

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

VariableData *
anon_unknown.dwarf_9fd58::AllocateClassMember
          (ExpressionContext *ctx,SynBase *source,uint alignment,TypeBase *type,InplaceStr name,
          bool readonly,uint uniqueId)

{
  Allocator *allocator;
  ScopeData *scope;
  uint offset;
  int iVar1;
  undefined4 extraout_var;
  SynIdentifier *name_00;
  undefined3 in_stack_00000009;
  VariableData *this;
  undefined4 extraout_var_00;
  
  if (alignment == 0) {
    alignment = type->alignment;
  }
  offset = AllocateVariableInScope(ctx,source,alignment,type);
  if (type->isGeneric != true) {
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    this = (VariableData *)CONCAT44(extraout_var,iVar1);
    allocator = ctx->allocator;
    scope = ctx->scope;
    iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    name_00 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar1);
    (name_00->super_SynBase).typeID = 4;
    (name_00->super_SynBase).begin = (Lexeme *)0x0;
    (name_00->super_SynBase).end = (Lexeme *)0x0;
    (name_00->super_SynBase).pos.begin = (char *)0x0;
    (name_00->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(name_00->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(name_00->super_SynBase).next + 2) = 0;
    (name_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
    (name_00->name).begin = name.begin;
    (name_00->name).end = name.end;
    VariableData::VariableData(this,allocator,source,scope,alignment,type,name_00,offset,_readonly);
    this->isReadonly = true;
    ExpressionContext::AddVariable(ctx,this,true);
    return this;
  }
  __assert_fail("!type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x339,
                "VariableData *(anonymous namespace)::AllocateClassMember(ExpressionContext &, SynBase *, unsigned int, TypeBase *, InplaceStr, bool, unsigned int)"
               );
}

Assistant:

VariableData* AllocateClassMember(ExpressionContext &ctx, SynBase *source, unsigned alignment, TypeBase *type, InplaceStr name, bool readonly, unsigned uniqueId)
	{
		if(alignment == 0)
			alignment = type->alignment;

		unsigned offset = AllocateVariableInScope(ctx, source, alignment, type);

		assert(!type->isGeneric);

		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(name), offset, uniqueId);

		variable->isReadonly = readonly;

		ctx.AddVariable(variable, true);

		return variable;
	}